

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

cl_int clMemFreeINTEL_EMU(cl_context context,void *ptr)

{
  cl_int cVar1;
  CLIntercept *this;
  SConfig *pSVar2;
  CLIntercept *pIntercept;
  void *in_stack_000000f8;
  cl_context in_stack_00000100;
  CLIntercept *in_stack_00000108;
  
  this = GetIntercept();
  if ((this != (CLIntercept *)0x0) &&
     (pSVar2 = CLIntercept::config(this), (pSVar2->Emulate_cl_intel_unified_shared_memory & 1U) != 0
     )) {
    cVar1 = CLIntercept::emulatedMemFree(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
    return cVar1;
  }
  return -0x3b;
}

Assistant:

cl_int CL_API_CALL clMemFreeINTEL_EMU(
    cl_context context,
    void* ptr)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedMemFree(
            context,
            ptr );
    }

    return CL_INVALID_OPERATION;
}